

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void absl::lts_20250127::container_internal::
     raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
     ::resize_impl(CommonFields *common,ulong new_capacity)

{
  ulong uVar1;
  ctrl_t *pcVar2;
  EnumValueDescriptor *pEVar3;
  bool bVar4;
  slot_type *psVar5;
  ulong uVar6;
  size_t sVar7;
  byte bVar8;
  size_t sVar9;
  undefined8 uVar10;
  byte bVar11;
  ctrl_t cVar12;
  ulong uVar13;
  FindInfo FVar14;
  HashSetResizeHelper resize_helper;
  undefined1 local_5a;
  undefined1 local_59;
  HeapOrSoo local_58;
  size_t local_48;
  byte local_40;
  char local_3f;
  byte local_3e;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("(IsValidCapacity(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe92,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>]"
                 );
  }
  if (new_capacity < 2) {
    __assert_fail("(!set->fits_in_soo(new_capacity)) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xe93,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>]"
                 );
  }
  sVar7 = common->capacity_;
  if (sVar7 == 0) {
    __assert_fail("cap >= kDefaultCapacity",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xb75,
                  "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>>::capacity() const [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>]"
                 );
  }
  bVar8 = 0x80;
  if (sVar7 == 1) {
    AssertNotDebugCapacity
              ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                *)common);
    if (1 < common->size_) {
      psVar5 = soo_slot((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                         *)common);
      bVar8 = (byte)(((ulong)(uint)(psVar5->value).first ^
                     (ulong)&hash_internal::MixingHashState::kSeed) * 0x5cb22ca68cb134ed >> 0x38) &
              0x7f;
      bVar11 = 1;
      goto LAB_001b32e3;
    }
  }
  bVar11 = 0;
LAB_001b32e3:
  local_48 = common->capacity_;
  local_40 = (byte)common->size_ & 1;
  local_3f = sVar7 == 1;
  local_58.heap.control = (common->heap_or_soo_).heap.control;
  local_58.heap.slot_array = (MaybeInitializedPtr)(common->heap_or_soo_).heap.slot_array.p;
  local_3e = bVar11;
  CommonFields::set_capacity(common,new_capacity);
  bVar4 = HashSetResizeHelper::InitializeSlots<std::allocator<char>,16ul,true,true,8ul>
                    ((HashSetResizeHelper *)&local_58,common,&local_59,(int)(char)bVar8,4,0x10);
  if (local_48 == 0) {
    __assert_fail("(resize_helper.old_capacity() > 0) && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0xeb6,
                  "static void absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, absl::hash_internal::Hash<int>, std::equal_to<int>, std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>>::resize_impl(CommonFields &, size_t, HashtablezInfoHandle) [Policy = absl::container_internal::FlatHashMapPolicy<int, const google::protobuf::EnumValueDescriptor *>, Hash = absl::hash_internal::Hash<int>, Eq = std::equal_to<int>, Alloc = std::allocator<std::pair<const int, const google::protobuf::EnumValueDescriptor *>>]"
                 );
  }
  if ((bVar11 | sVar7 != 1) == 1) {
    psVar5 = slot_array((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_const_google::protobuf::EnumValueDescriptor_*>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::EnumValueDescriptor_*>_>_>
                         *)common);
    if (!bVar4) {
      if (sVar7 == 1) {
        uVar13 = ((ulong)local_58.heap.control & 0xffffffff ^
                 (ulong)&hash_internal::MixingHashState::kSeed) * -0x234dd359734ecb13;
        FVar14 = find_first_non_full<void>
                           (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                   (uVar13 & 0xff0000000000) >> 0x18 | (uVar13 & 0xff00000000) >> 8
                                   | (uVar13 & 0xff000000) << 8 | (uVar13 & 0xff0000) << 0x18 |
                                   (uVar13 & 0xff00) << 0x28 | uVar13 << 0x38);
        uVar6 = FVar14.offset;
        uVar1 = common->capacity_;
        if (uVar1 <= uVar6) {
LAB_001b34f4:
          __assert_fail("(i < c.capacity()) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x744,
                        "void absl::container_internal::DoSanitizeOnSetCtrl(const CommonFields &, size_t, ctrl_t, size_t)"
                       );
        }
        cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
        pcVar2 = (common->heap_or_soo_).heap.control;
        pcVar2[uVar6] = cVar12;
        pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar6 - 0xf & uVar1)] = cVar12;
        common->capacity_ = 0xffffffffffffff9c;
        *(ctrl_t **)(psVar5 + uVar6) = local_58.heap.control;
        psVar5[uVar6].value.second = (EnumValueDescriptor *)local_58.heap.slot_array;
        CommonFields::set_capacity(common,uVar1);
      }
      else {
        if (local_3f == '\x01') {
          __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0x7ea,
                        "void *absl::container_internal::HashSetResizeHelper::old_slots() const");
        }
        if (local_48 != 0) {
          sVar9 = 0;
          sVar7 = local_48;
          uVar10 = local_58.heap.slot_array;
          do {
            if (local_3f == '\x01') {
              __assert_fail("(!was_soo_) && \"Try enabling sanitizers.\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x7e6,
                            "ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const"
                           );
            }
            if (kSentinel < local_58.heap.control[sVar9]) {
              uVar13 = ((ulong)*(uint *)uVar10 ^ 0x572bc8) * -0x234dd359734ecb13;
              FVar14 = find_first_non_full<void>
                                 (common,uVar13 >> 0x38 | (uVar13 & 0xff000000000000) >> 0x28 |
                                         (uVar13 & 0xff0000000000) >> 0x18 |
                                         (uVar13 & 0xff00000000) >> 8 | (uVar13 & 0xff000000) << 8 |
                                         (uVar13 & 0xff0000) << 0x18 | (uVar13 & 0xff00) << 0x28 |
                                         uVar13 << 0x38);
              uVar6 = FVar14.offset;
              uVar1 = common->capacity_;
              if (uVar1 <= uVar6) goto LAB_001b34f4;
              cVar12 = (ctrl_t)(uVar13 >> 0x38) & ~kEmpty;
              pcVar2 = (common->heap_or_soo_).heap.control;
              pcVar2[uVar6] = cVar12;
              pcVar2[(ulong)((uint)uVar1 & 0xf) + (uVar6 - 0xf & uVar1)] = cVar12;
              common->capacity_ = 0xffffffffffffff9c;
              pEVar3 = *(EnumValueDescriptor **)(uVar10 + 8);
              *(undefined8 *)(psVar5 + uVar6) = *(undefined8 *)uVar10;
              psVar5[uVar6].value.second = pEVar3;
              CommonFields::set_capacity(common,uVar1);
              sVar7 = local_48;
            }
            sVar9 = sVar9 + 1;
            uVar10 = uVar10 + 0x10;
          } while (sVar9 != sVar7);
        }
        if ((common->size_ & 1) != 0) {
          CommonFields::backing_array_start(common);
        }
        HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
                  ((HashSetResizeHelper *)&local_58,&local_5a,0x10);
      }
    }
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }